

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O0

void call_laspack_method(IterProcType method,Sparse_matrix *lh_side,double *unknown_vector,
                        double *rh_side,double max_iterations,PrecondProcType preconditioner,
                        double relaxation_constant)

{
  undefined1 local_150 [8];
  Vector unknown_vector_laspack;
  Vector rh_side_laspack;
  QMatrix lh_side_laspack;
  double relaxation_constant_local;
  PrecondProcType preconditioner_local;
  double max_iterations_local;
  double *rh_side_local;
  double *unknown_vector_local;
  Sparse_matrix *lh_side_local;
  IterProcType method_local;
  
  Q_Constr((QMatrix *)&rh_side_laspack.Cmp,"Matrix",(ulong)lh_side->size,False,Rowws,Normal,True);
  V_Constr((Vector *)&unknown_vector_laspack.Cmp,"Right-hand side of equation",(ulong)lh_side->size,
           Normal,False);
  V_Constr((Vector *)local_150,"Unknown vector",(ulong)lh_side->size,Normal,False);
  Sparse_matrix_to_QMatrix(lh_side,(QMatrix *)&rh_side_laspack.Cmp);
  rh_side_laspack._32_8_ = rh_side + -1;
  unknown_vector_laspack._32_8_ = unknown_vector + -1;
  (*method)((QMatrix *)&rh_side_laspack.Cmp,(Vector *)local_150,
            (Vector *)&unknown_vector_laspack.Cmp,(int)max_iterations,preconditioner,
            relaxation_constant);
  Q_Destr((QMatrix *)&rh_side_laspack.Cmp);
  V_Destr((Vector *)&unknown_vector_laspack.Cmp);
  V_Destr((Vector *)local_150);
  return;
}

Assistant:

void call_laspack_method (
    IterProcType    method,
    Sparse_matrix * lh_side,
    double        * unknown_vector,
    double        * rh_side,
    double          max_iterations,
    PrecondProcType preconditioner,
    double          relaxation_constant) {

  QMatrix lh_side_laspack;
  Vector rh_side_laspack;
  Vector unknown_vector_laspack;

  Q_Constr (&lh_side_laspack,
            "Matrix",
            lh_side->size, /* side */
            False, /* non-symmetric */
            Rowws, /* row-wise storage */
            Normal,
            True);
  V_Constr (&rh_side_laspack,
            "Right-hand side of equation",
            lh_side->size,
            Normal,
            False); /* we pass our own data */
  V_Constr (&unknown_vector_laspack,
            "Unknown vector",
            lh_side->size,
            Normal,
            False); /* the same here */

  Sparse_matrix_to_QMatrix (lh_side, &lh_side_laspack);

  /* Laspack Vector indices start with 1 */
  rh_side_laspack.Cmp = rh_side - 1;
  unknown_vector_laspack.Cmp = unknown_vector - 1;

  (*method) (&lh_side_laspack,
             &unknown_vector_laspack,
             &rh_side_laspack,
             max_iterations,
             preconditioner,
             relaxation_constant);

  Q_Destr (&lh_side_laspack);
  V_Destr (&rh_side_laspack);
  V_Destr (&unknown_vector_laspack);

}